

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusBGPlanner.cpp
# Opt level: O0

void __thiscall
PerseusBGPlanner::PerseusBGPlanner
          (PerseusBGPlanner *this,shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *pu,
          QAVParameters *params)

{
  long in_RDX;
  shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *in_RDI;
  shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *in_stack_00000040;
  void **in_stack_00000048;
  AlphaVectorBG *in_stack_00000050;
  shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *in_stack_000000a8;
  AlphaVectorPlanning *in_stack_000000b0;
  AlphaVectorPlanning *in_stack_000005b0;
  void **in_stack_ffffffffffffffd8;
  PerseusQFunctionPlanner *in_stack_ffffffffffffffe0;
  
  AlphaVectorPlanning::AlphaVectorPlanning(in_stack_000000b0,in_stack_000000a8);
  AlphaVectorBG::AlphaVectorBG(in_stack_00000050,in_stack_00000048,in_stack_00000040);
  PerseusQFunctionPlanner::PerseusQFunctionPlanner
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_RDI);
  in_RDI->px = (element_type *)&PTR__PerseusBGPlanner_00d0f990;
  in_RDI[0xe].pn.pi_ = (sp_counted_base *)&PTR__PerseusBGPlanner_00d0fa58;
  in_RDI[1].pn.pi_ = (sp_counted_base *)&PTR_GetImmediateRewardBeliefSet_00d0f9c8;
  *(undefined4 *)&in_RDI[0xe].px = *(undefined4 *)(in_RDX + 0x14);
  AlphaVectorPlanning::Initialize(in_stack_000005b0);
  Perseus::Initialize((Perseus *)&in_RDI[1].pn);
  return;
}

Assistant:

PerseusBGPlanner::PerseusBGPlanner(const boost::shared_ptr<const PlanningUnitDecPOMDPDiscrete> &pu,
                                   const QAVParameters& params) :
    AlphaVectorPlanning(pu),
    AlphaVectorBG(pu),
    PerseusQFunctionPlanner(pu),
    _m_backupType(params.bgBackupType)
{
    AlphaVectorPlanning::Initialize();
    Perseus::Initialize();
}